

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::CappedArray<char,5ul>>
          (String *__return_storage_ptr__,_ *this,FixedArray<char,_1UL> *params,StringPtr *params_1,
          CappedArray<char,_5UL> *params_2)

{
  void *__src;
  char *__n;
  long lVar1;
  size_t size;
  _ *p_Var2;
  _ *__dest;
  long local_40 [2];
  char *local_30;
  
  local_40[0] = 1;
  local_40[1] = *(long *)(params + 8) + -1;
  local_30 = (params_1->content).ptr;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_40 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  heapString(__return_storage_ptr__,size);
  p_Var2 = (_ *)(__return_storage_ptr__->content).size_;
  if (p_Var2 != (_ *)0x0) {
    p_Var2 = (_ *)(__return_storage_ptr__->content).ptr;
  }
  __dest = p_Var2 + 1;
  *p_Var2 = *this;
  __src = *(void **)params;
  lVar1 = *(long *)(params + 8);
  if (__src != (void *)((long)__src + lVar1 + -1)) {
    memcpy(__dest,__src,lVar1 - 1);
    __dest = p_Var2 + lVar1;
  }
  __n = (params_1->content).ptr;
  if (__n != (char *)0x0) {
    memcpy(__dest,&(params_1->content).size_,(size_t)__n);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}